

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void code_gen_alloc(uc_struct_conflict15 *uc,size_t tb_size)

{
  TCGContext_conflict9 *pTVar1;
  size_t sVar2;
  void *pvVar3;
  TCGContext_conflict9 *tcg_ctx;
  size_t tb_size_local;
  uc_struct_conflict15 *uc_local;
  
  pTVar1 = uc->tcg_ctx;
  sVar2 = size_code_gen_buffer(tb_size);
  pTVar1->code_gen_buffer_size = sVar2;
  pvVar3 = alloc_code_gen_buffer(uc);
  pTVar1->code_gen_buffer = pvVar3;
  pTVar1->initial_buffer = pTVar1->code_gen_buffer;
  pTVar1->initial_buffer_size = pTVar1->code_gen_buffer_size;
  uc->tcg_buffer_size = (uint32_t)pTVar1->initial_buffer_size;
  if (pTVar1->code_gen_buffer == (void *)0x0) {
    fprintf(_stderr,"Could not allocate dynamic translator buffer\n");
    exit(1);
  }
  return;
}

Assistant:

static inline void code_gen_alloc(struct uc_struct *uc, size_t tb_size)
{
    TCGContext *tcg_ctx = uc->tcg_ctx;
    tcg_ctx->code_gen_buffer_size = size_code_gen_buffer(tb_size);
    tcg_ctx->code_gen_buffer = alloc_code_gen_buffer(uc);
    tcg_ctx->initial_buffer = tcg_ctx->code_gen_buffer;
    tcg_ctx->initial_buffer_size = tcg_ctx->code_gen_buffer_size;
    uc->tcg_buffer_size = tcg_ctx->initial_buffer_size;
    if (tcg_ctx->code_gen_buffer == NULL) {
        fprintf(stderr, "Could not allocate dynamic translator buffer\n");
        exit(1);
    }
}